

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

http_settings_s * http_settings_new(http_settings_s arg_settings)

{
  ulong uVar1;
  size_t sVar2;
  http_settings_s *__dest;
  size_t sVar3;
  char *pcVar4;
  char *__dest_00;
  char *tmp;
  size_t home_len;
  char *home;
  http_settings_s *settings;
  
  if (((long)arg_settings.max_body_size < 1) ||
     (uVar1 = arg_settings.max_body_size + 0x40, sVar2 = fio_capa(), sVar2 < uVar1)) {
    fio_capa();
  }
  __dest = (http_settings_s *)malloc(0x88);
  memcpy(__dest,&stack0x00000008,0x80);
  if (__dest->public_folder != (char *)0x0) {
    sVar3 = strlen(__dest->public_folder);
    __dest->public_folder_length = sVar3;
    if (((*__dest->public_folder == '~') && (__dest->public_folder[1] == '/')) &&
       (pcVar4 = getenv("HOME"), pcVar4 != (char *)0x0)) {
      pcVar4 = getenv("HOME");
      tmp = (char *)strlen(pcVar4);
      __dest_00 = (char *)malloc((size_t)(tmp + __dest->public_folder_length + 1));
      memcpy(__dest_00,pcVar4,(size_t)tmp);
      if (pcVar4[(long)(tmp + -1)] == '/') {
        tmp = tmp + -1;
      }
      memcpy(__dest_00 + (long)tmp,__dest->public_folder + 1,__dest->public_folder_length);
      __dest->public_folder = __dest_00;
      sVar3 = strlen(__dest->public_folder);
      __dest->public_folder_length = sVar3;
    }
    else {
      pcVar4 = (char *)malloc(__dest->public_folder_length + 1);
      __dest->public_folder = pcVar4;
      memcpy(__dest->public_folder,arg_settings.udata,__dest->public_folder_length);
      __dest->public_folder[__dest->public_folder_length] = '\0';
    }
  }
  return __dest;
}

Assistant:

static http_settings_s *http_settings_new(http_settings_s arg_settings) {
  /* TODO: improve locality by unifying malloc to a single call */
  if (!arg_settings.on_request)
    arg_settings.on_request = http_on_request_fallback;
  if (!arg_settings.on_response)
    arg_settings.on_response = http_on_response_fallback;
  if (!arg_settings.on_upgrade)
    arg_settings.on_upgrade = http_on_upgrade_fallback;

  if (!arg_settings.max_body_size)
    arg_settings.max_body_size = HTTP_DEFAULT_BODY_LIMIT;
  if (!arg_settings.timeout)
    arg_settings.timeout = 40;
  if (!arg_settings.ws_max_msg_size)
    arg_settings.ws_max_msg_size = 262144; /** defaults to ~250KB */
  if (!arg_settings.ws_timeout)
    arg_settings.ws_timeout = 40; /* defaults to 40 seconds */
  if (!arg_settings.max_header_size)
    arg_settings.max_header_size = 32 * 1024; /* defaults to 32Kib seconds */
  if (arg_settings.max_clients <= 0 ||
      (size_t)(arg_settings.max_clients + HTTP_BUSY_UNLESS_HAS_FDS) >
          fio_capa()) {
    arg_settings.max_clients = fio_capa();
    if ((ssize_t)arg_settings.max_clients - HTTP_BUSY_UNLESS_HAS_FDS > 0)
      arg_settings.max_clients -= HTTP_BUSY_UNLESS_HAS_FDS;
  }

  http_settings_s *settings = malloc(sizeof(*settings) + sizeof(void *));
  *settings = arg_settings;

  if (settings->public_folder) {
    settings->public_folder_length = strlen(settings->public_folder);
    if (settings->public_folder[0] == '~' &&
        settings->public_folder[1] == '/' && getenv("HOME")) {
      char *home = getenv("HOME");
      size_t home_len = strlen(home);
      char *tmp = malloc(settings->public_folder_length + home_len + 1);
      memcpy(tmp, home, home_len);
      if (home[home_len - 1] == '/')
        --home_len;
      memcpy(tmp + home_len, settings->public_folder + 1,
             settings->public_folder_length); // copy also the NULL
      settings->public_folder = tmp;
      settings->public_folder_length = strlen(settings->public_folder);
    } else {
      settings->public_folder = malloc(settings->public_folder_length + 1);
      memcpy((void *)settings->public_folder, arg_settings.public_folder,
             settings->public_folder_length);
      ((uint8_t *)settings->public_folder)[settings->public_folder_length] = 0;
    }
  }
  return settings;
}